

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintBytesInObjectTo(uchar *buf,size_t size,iu_ostream *os)

{
  ostream *poVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  size_t i;
  size_t sVar5;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::operator<<(poVar1,"-Byte object < ");
  if (size != 0 && buf != (uchar *)0x0) {
    for (sVar5 = 0; size != sVar5; sVar5 = sVar5 + 1) {
      if (sVar5 == 0x20) {
        std::operator<<(os,"... ");
        break;
      }
      bVar4 = buf[sVar5];
      bVar2 = bVar4 >> 4 | 0x30;
      if (0x9f < bVar4) {
        bVar2 = (bVar4 >> 4) + 0x37;
      }
      poVar1 = std::operator<<(os,bVar2);
      bVar4 = bVar4 & 0xf;
      cVar3 = bVar4 + 0x30;
      if (9 < bVar4) {
        cVar3 = bVar4 + 0x37;
      }
      poVar1 = std::operator<<(poVar1,cVar3);
      std::operator<<(poVar1," ");
    }
  }
  std::operator<<(os,">");
  return;
}

Assistant:

inline void PrintBytesInObjectTo(const unsigned char* buf, size_t size, iu_ostream* os)
{
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
    const size_t kMaxCount = detail::kValues::MaxPrintContainerCount;
    *os << size << "-Byte object < ";
    if( buf != IUTEST_NULLPTR && size > 0 )
    {
        for( size_t i=0; i < size; ++i )
        {
            if( i == kMaxCount )
            {
                *os << "... ";
                break;
            }
#ifdef __clang_analyzer__
            const unsigned char n = 0;  // suppress
#else
            const unsigned char n = buf[i];
#endif
            *os << ToHex((n>>4)&0xF) << ToHex(n&0xF) << " ";
        }
    }
    *os << ">";
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
}